

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O2

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,SpatialVector *axis_0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  SpatialVector *pSVar7;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  this->mDoFCount = 1;
  pSVar7 = (SpatialVector *)operator_new__(0x30);
  this->mJointAxes = pSVar7;
  dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar2 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar3 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar4 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  dVar5 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = dVar1;
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = dVar2;
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar3;
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = dVar4;
  (pSVar7->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar5;
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  bVar6 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                    ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)axis_0,
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_48);
  if (bVar6) {
    this->mJointType = JointTypeRevoluteX;
  }
  else {
    local_48 = 0;
    uStack_40 = 0x3ff0000000000000;
    uStack_38 = 0;
    uStack_30 = 0;
    uStack_28 = 0;
    local_20 = 0;
    bVar6 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                      ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)axis_0,
                       (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_48);
    if (bVar6) {
      this->mJointType = JointTypeRevoluteY;
    }
    else {
      local_48 = 0;
      uStack_40 = 0;
      uStack_38 = 0x3ff0000000000000;
      uStack_30 = 0;
      uStack_28 = 0;
      local_20 = 0;
      bVar6 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                        ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)axis_0,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_48);
      if (bVar6) {
        this->mJointType = JointTypeRevoluteZ;
      }
      else {
        dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [0];
        if ((((dVar1 != 0.0) || (NAN(dVar1))) ||
            (dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[1], dVar1 != 0.0)) ||
           (((NAN(dVar1) ||
             (dVar1 = (axis_0->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array[2], dVar1 != 0.0)) || (NAN(dVar1))))) {
          this->mJointType = JointTypeHelical;
        }
        else {
          this->mJointType = JointTypePrismatic;
        }
      }
    }
  }
  validate_spatial_axis(this,this->mJointAxes);
  return;
}

Assistant:

Joint (
    const Math::SpatialVector &axis_0
  )
  {
    mDoFCount = 1;
    mJointAxes = new Math::SpatialVector[mDoFCount];
    mJointAxes[0] = Math::SpatialVector (axis_0);
    
    // TODO this has to be properly determined AND test case. Try Matt's dot product idea
#ifdef RBDL_USE_CASADI_MATH
    if (!axis_0[0].is_zero()) {
#else
    if (axis_0 == Math::SpatialVector(1., 0., 0., 0., 0., 0.)) {
#endif
      mJointType = JointTypeRevoluteX;
#ifdef RBDL_USE_CASADI_MATH
    } else if (!axis_0[1].is_zero()) {
#else
    } else if (axis_0 == Math::SpatialVector(0., 1., 0., 0., 0., 0.)) {
#endif
      mJointType = JointTypeRevoluteY;
#ifdef RBDL_USE_CASADI_MATH
    } else if (!axis_0[2].is_zero()) {
#else
    } else if (axis_0 == Math::SpatialVector(0., 0., 1., 0., 0., 0.)) {
#endif
      mJointType = JointTypeRevoluteZ;
#ifdef RBDL_USE_CASADI_MATH
    } else if (axis_0[0].is_zero() && axis_0[1].is_zero() && axis_0[2].is_zero()) {
#else
    } else if (axis_0[0] == 0. && axis_0[1] == 0. && axis_0[2] == 0.) {
#endif
      mJointType = JointTypePrismatic;
    } else {
      mJointType = JointTypeHelical;
    }
    validate_spatial_axis (mJointAxes[0]);
  }

  /** \brief Constructs a 2 DoF joint with the given motion subspaces.
   *
   * The motion subspaces are of the format:
   * \f[ (r_x, r_y, r_z, t_x, t_y, t_z) \f]
   *
   * \note So far only pure rotations or pure translations are supported.
   *
   * \param axis_0 Motion subspace for axis 0
   * \param axis_1 Motion subspace for axis 1
   */
  Joint (
    const Math::SpatialVector &axis_0,
    const Math::SpatialVector &axis_1
  )
  {
    mJointType = JointType2DoF;
    mDoFCount = 2;

    mJointAxes = new Math::SpatialVector[mDoFCount];
    mJointAxes[0] = axis_0;
    mJointAxes[1] = axis_1;

    validate_spatial_axis (mJointAxes[0]);
    validate_spatial_axis (mJointAxes[1]);
  }

  /** \brief Constructs a 3 DoF joint with the given motion subspaces.
   *
   * The motion subspaces are of the format:
   * \f[ (r_x, r_y, r_z, t_x, t_y, t_z) \f]
   *
   * \note So far only pure rotations or pure translations are supported.
   *
   * \param axis_0 Motion subspace for axis 0
   * \param axis_1 Motion subspace for axis 1
   * \param axis_2 Motion subspace for axis 2
   */
  Joint (
    const Math::SpatialVector &axis_0,
    const Math::SpatialVector &axis_1,
    const Math::SpatialVector &axis_2
  )
  {
    mJointType = JointType3DoF;
    mDoFCount = 3;

    mJointAxes = new Math::SpatialVector[mDoFCount];

    mJointAxes[0] = axis_0;
    mJointAxes[1] = axis_1;
    mJointAxes[2] = axis_2;

    validate_spatial_axis (mJointAxes[0]);
    validate_spatial_axis (mJointAxes[1]);
    validate_spatial_axis (mJointAxes[2]);
  }

  /** \brief Constructs a 4 DoF joint with the given motion subspaces.
   *
   * The motion subspaces are of the format:
   * \f[ (r_x, r_y, r_z, t_x, t_y, t_z) \f]
   *
   * \note So far only pure rotations or pure translations are supported.
   *
   * \param axis_0 Motion subspace for axis 0
   * \param axis_1 Motion subspace for axis 1
   * \param axis_2 Motion subspace for axis 2
   * \param axis_3 Motion subspace for axis 3
   */
  Joint (
    const Math::SpatialVector &axis_0,
    const Math::SpatialVector &axis_1,
    const Math::SpatialVector &axis_2,
    const Math::SpatialVector &axis_3
  )
  {
    mJointType = JointType4DoF;
    mDoFCount = 4;

    mJointAxes = new Math::SpatialVector[mDoFCount];

    mJointAxes[0] = axis_0;
    mJointAxes[1] = axis_1;
    mJointAxes[2] = axis_2;
    mJointAxes[3] = axis_3;

    validate_spatial_axis (mJointAxes[0]);
    validate_spatial_axis (mJointAxes[1]);
    validate_spatial_axis (mJointAxes[2]);
    validate_spatial_axis (mJointAxes[3]);
  }

  /** \brief Constructs a 5 DoF joint with the given motion subspaces.
   *
   * The motion subspaces are of the format:
   * \f[ (r_x, r_y, r_z, t_x, t_y, t_z) \f]
   *
   * \note So far only pure rotations or pure translations are supported.
   *
   * \param axis_0 Motion subspace for axis 0
   * \param axis_1 Motion subspace for axis 1
   * \param axis_2 Motion subspace for axis 2
   * \param axis_3 Motion subspace for axis 3
   * \param axis_4 Motion subspace for axis 4
   */
  Joint (
    const Math::SpatialVector &axis_0,
    const Math::SpatialVector &axis_1,
    const Math::SpatialVector &axis_2,
    const Math::SpatialVector &axis_3,
    const Math::SpatialVector &axis_4
  )
  {
    mJointType = JointType5DoF;
    mDoFCount = 5;

    mJointAxes = new Math::SpatialVector[mDoFCount];

    mJointAxes[0] = axis_0;
    mJointAxes[1] = axis_1;
    mJointAxes[2] = axis_2;
    mJointAxes[3] = axis_3;
    mJointAxes[4] = axis_4;

    validate_spatial_axis (mJointAxes[0]);
    validate_spatial_axis (mJointAxes[1]);
    validate_spatial_axis (mJointAxes[2]);
    validate_spatial_axis (mJointAxes[3]);
    validate_spatial_axis (mJointAxes[4]);
  }

  /** \brief Constructs a 6 DoF joint with the given motion subspaces.
   *
   * The motion subspaces are of the format:
   * \f[ (r_x, r_y, r_z, t_x, t_y, t_z) \f]
   *
   * \note So far only pure rotations or pure translations are supported.
   *
   * \param axis_0 Motion subspace for axis 0
   * \param axis_1 Motion subspace for axis 1
   * \param axis_2 Motion subspace for axis 2
   * \param axis_3 Motion subspace for axis 3
   * \param axis_4 Motion subspace for axis 4
   * \param axis_5 Motion subspace for axis 5
   */
  Joint (
    const Math::SpatialVector &axis_0,
    const Math::SpatialVector &axis_1,
    const Math::SpatialVector &axis_2,
    const Math::SpatialVector &axis_3,
    const Math::SpatialVector &axis_4,
    const Math::SpatialVector &axis_5
  )
  {
    mJointType = JointType6DoF;
    mDoFCount = 6;

    mJointAxes = new Math::SpatialVector[mDoFCount];

    mJointAxes[0] = axis_0;
    mJointAxes[1] = axis_1;
    mJointAxes[2] = axis_2;
    mJointAxes[3] = axis_3;
    mJointAxes[4] = axis_4;
    mJointAxes[5] = axis_5;

    validate_spatial_axis (mJointAxes[0]);
    validate_spatial_axis (mJointAxes[1]);
    validate_spatial_axis (mJointAxes[2]);
    validate_spatial_axis (mJointAxes[3]);
    validate_spatial_axis (mJointAxes[4]);
    validate_spatial_axis (mJointAxes[5]);
  }

  /** \brief Checks whether we have pure rotational or translational axis.
   *
   * This function is mainly used to print out warnings when specifying an
   * axis that might not be intended.
   */
  bool validate_spatial_axis (Math::SpatialVector &axis)
  {
#ifdef RBDL_USE_CASADI_MATH
      // If using casadi, the axes won't be validated
      return true;
#else
    bool axis_rotational = false;
    bool axis_translational = false;

    Math::Vector3d rotation (axis[0], axis[1], axis[2]);
    Math::Vector3d translation (axis[3], axis[4], axis[5]);

    if (fabs(rotation.norm()) > 1.0e-8) {
      axis_rotational = true;
    }

    if (fabs(translation.norm()) > 1.0e-8) {
      axis_translational = true;
    }

    if(axis_rotational && rotation.norm() - 1.0 > 1.0e-8) {
      std::cerr << "Warning: joint rotation axis is not unit!" << std::endl;
    }

    if(axis_translational && translation.norm() - 1.0 > 1.0e-8) {
      std::cerr << "Warning: joint translation axis is not unit!" << std::endl;
    }

    return axis_rotational != axis_translational;
#endif
  }

  /// \brief The spatial axes of the joint
  Math::SpatialVector* mJointAxes;
  /// \brief Type of joint
  JointType mJointType;
  /// \brief Number of degrees of freedom of the joint. Note: CustomJoints
  // have here a value of 0 and their actual numbers of degrees of freedom
  // can be obtained using the CustomJoint structure.
  unsigned int mDoFCount;
  unsigned int q_index;
  unsigned int custom_joint_index;
};

/** \brief Computes all variables for a joint model
 *
 *  By appropriate modification of this function all types of joints can be
 *  modeled. See RBDA Section 4.4 for details.
 *
 * \param model    the rigid body model
 * \param joint_id the id of the joint we are interested in. This will be used to determine the type of joint and also the entries of \f[ q, \dot{q} \f].
 * \param q        joint state variables
 * \param qdot     joint velocity variables
 */
RBDL_DLLAPI
void jcalc (
  Model &model,
  unsigned int joint_id,
  const Math::VectorNd &q,
  const Math::VectorNd &qdot
);

RBDL_DLLAPI
Math::SpatialTransform jcalc_XJ (
  Model &model,
  unsigned int joint_id,
  const Math::VectorNd &q);

RBDL_DLLAPI
void jcalc_X_lambda_S (
  Model &model,
  unsigned int joint_id,
  const Math::VectorNd &q
);

struct RBDL_DLLAPI CustomJoint {
  CustomJoint()
  { }
  virtual ~CustomJoint() {};

  virtual void jcalc (Model &model,
                      unsigned int joint_id,
                      const Math::VectorNd &q,
                      const Math::VectorNd &qdot
                     ) = 0;
  virtual void jcalc_X_lambda_S (Model &model,
                                 unsigned int joint_id,
                                 const Math::VectorNd &q
                                ) = 0;

  unsigned int mDoFCount;
  Math::SpatialTransform XJ;
  Math::MatrixNd S;
  Math::MatrixNd U;
  Math::MatrixNd Dinv;
  Math::VectorNd u;
  Math::VectorNd d_u;
};

}